

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_sse2.cpp
# Opt level: O2

void src_Source(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint3 uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  int iVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  uint32_t uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  uint32_t *puVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  int iVar38;
  short sVar42;
  undefined2 uVar43;
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  byte bVar48;
  undefined1 auVar44 [16];
  int iVar49;
  ushort uVar50;
  int iVar51;
  ushort uVar52;
  int iVar53;
  int iVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar75;
  ushort uVar76;
  int5 iVar71;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  short sStack_54;
  short sStack_52;
  short sStack_4c;
  short sStack_4a;
  short sStack_44;
  short sStack_42;
  short sStack_3c;
  short sStack_3a;
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar72 [12];
  undefined1 auVar73 [14];
  undefined1 auVar74 [16];
  
  if (const_alpha == 0xff) {
    memcpy(dest,src,(long)length << 2);
    return;
  }
  lVar34 = 0;
  puVar35 = dest;
  for (lVar36 = 0; (((ulong)puVar35 & 0xf) != 0 && (length != (int)lVar36)); lVar36 = lVar36 + 1) {
    uVar32 = interpolate_pixel(src[lVar36],const_alpha,dest[lVar36],0xff - const_alpha);
    dest[lVar36] = uVar32;
    lVar34 = lVar34 + -4;
    puVar35 = puVar35 + 1;
  }
  auVar39._0_8_ = CONCAT44(const_alpha,const_alpha);
  auVar39._8_4_ = const_alpha;
  uVar43 = (undefined2)(const_alpha >> 0x10);
  auVar47._12_2_ = uVar43;
  auVar47._0_12_ = auVar39;
  auVar47._14_2_ = uVar43;
  sVar42 = (short)const_alpha;
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = auVar39._0_10_;
  auVar46._10_2_ = sVar42;
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._8_2_ = sVar42;
  auVar45._0_8_ = auVar39._0_8_;
  auVar44._8_8_ = auVar45._8_8_;
  auVar44._6_2_ = uVar43;
  auVar44._4_2_ = uVar43;
  auVar44._0_4_ = const_alpha;
  auVar40._0_8_ = CONCAT26(uVar43,CONCAT24(uVar43,CONCAT22(sVar42,sVar42)));
  auVar40._8_2_ = sVar42;
  auVar40._10_2_ = sVar42;
  auVar41._12_2_ = uVar43;
  auVar41._0_12_ = auVar40;
  auVar41._14_2_ = uVar43;
  iVar49 = CONCAT22(sVar42,sVar42) + auVar44._4_4_;
  iVar51 = auVar45._8_4_ + auVar46._12_4_;
  iVar53 = CONCAT22(sVar42,sVar42) + (int)((ulong)auVar40._0_8_ >> 0x20);
  iVar54 = auVar40._8_4_ + auVar41._12_4_;
  pauVar33 = (undefined1 (*) [16])((long)src - lVar34);
  iVar38 = length - (int)lVar36;
  pauVar37 = (undefined1 (*) [16])((long)dest - lVar34);
  do {
    if (iVar38 - 1U < 3) {
      uVar32 = interpolate_pixel(*(uint32_t *)*pauVar33,const_alpha,*(uint32_t *)*pauVar37,
                                 0xff - const_alpha);
      *(uint32_t *)*pauVar37 = uVar32;
      iVar24 = -1;
      lVar34 = 4;
    }
    else {
      if (iVar38 == 0) {
        return;
      }
      auVar41 = *pauVar33;
      auVar44 = *pauVar37;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar41._0_13_;
      auVar3[0xe] = auVar41[7];
      auVar5[0xc] = auVar41[6];
      auVar5._0_12_ = auVar41._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar41._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar41[5];
      auVar9._0_10_ = auVar41._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar41._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar15[8] = auVar41[4];
      auVar15._0_8_ = auVar41._0_8_;
      auVar15._9_6_ = auVar11._9_6_;
      auVar17._7_8_ = 0;
      auVar17._0_7_ = auVar15._8_7_;
      Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar41[3]);
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var18;
      auVar19._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar19[0] = auVar41[2];
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar19;
      auVar20._1_12_ = SUB1512(auVar26 << 0x20,3);
      auVar20[0] = auVar41[1];
      auVar29[10] = 0;
      auVar29._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar29[0xb] = auVar44[5];
      auVar30[9] = auVar44[4];
      auVar30._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar30._10_2_ = auVar29._10_2_;
      auVar31._9_3_ = auVar30._9_3_;
      auVar31._0_9_ = (unkuint9)0;
      auVar45 = ZEXT516(CONCAT41(auVar31._8_4_,auVar44[3])) << 0x38;
      auVar13._1_10_ = auVar45._6_10_;
      auVar13[0] = auVar44[2];
      auVar13._11_5_ = 0;
      auVar12._1_12_ = SUB1612(auVar13 << 0x28,4);
      auVar12[0] = auVar44[1];
      auVar12._13_3_ = 0;
      uVar1 = CONCAT12(auVar44[9],(ushort)auVar44[8]);
      iVar71 = (uint5)uVar1 << 8;
      bVar48 = auVar44[0xb];
      auVar72._0_10_ = CONCAT19(auVar44[0xc],(unkuint9)bVar48 << 0x38);
      auVar72[10] = 0;
      auVar72[0xb] = auVar44[0xd];
      auVar73[0xc] = 0;
      auVar73._0_12_ = auVar72;
      auVar73[0xd] = auVar44[0xe];
      auVar74[0xe] = 0;
      auVar74._0_14_ = auVar73;
      auVar74[0xf] = auVar44[0xf];
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar44._0_13_;
      auVar2[0xe] = auVar44[7];
      auVar4[0xc] = auVar44[6];
      auVar4._0_12_ = auVar44._0_12_;
      auVar4._13_2_ = auVar2._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar44._0_11_;
      auVar6._12_3_ = auVar4._12_3_;
      auVar8[10] = auVar44[5];
      auVar8._0_10_ = auVar44._0_10_;
      auVar8._11_4_ = auVar6._11_4_;
      auVar10[9] = 0;
      auVar10._0_9_ = auVar44._0_9_;
      auVar10._10_5_ = auVar8._10_5_;
      auVar14[8] = auVar44[4];
      auVar14._0_8_ = auVar44._0_8_;
      auVar14._9_6_ = auVar10._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar14._8_7_;
      Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),auVar44[3]);
      auVar27._9_6_ = 0;
      auVar27._0_9_ = Var22;
      auVar23._1_10_ = SUB1510(auVar27 << 0x30,5);
      auVar23[0] = auVar44[2];
      auVar28._11_4_ = 0;
      auVar28._0_11_ = auVar23;
      auVar16[2] = auVar44[1];
      auVar16._0_2_ = auVar44._0_2_;
      auVar16._3_12_ = SUB1512(auVar28 << 0x20,3);
      sStack_44 = (short)iVar49;
      sStack_42 = (short)((uint)iVar49 >> 0x10);
      sStack_3c = (short)iVar51;
      sStack_3a = (short)((uint)iVar51 >> 0x10);
      uVar50 = (auVar5._12_2_ - auVar4._12_2_) * sStack_3c;
      uVar52 = ((auVar3._13_2_ >> 8) - (auVar2._13_2_ >> 8)) * sStack_3a;
      sStack_54 = (short)iVar53;
      sStack_52 = (short)((uint)iVar53 >> 0x10);
      sStack_4c = (short)iVar54;
      sStack_4a = (short)((uint)iVar54 >> 0x10);
      uVar55 = (ushort)auVar44[0] * 0x100 + ((ushort)auVar41[0] - (auVar44._0_2_ & 0xff)) * sVar42;
      uVar57 = SUB162(auVar12 << 0x18,2) + (auVar20._0_2_ - auVar16._2_2_) * sVar42;
      uVar59 = SUB162(auVar13 << 0x28,4) + (auVar19._0_2_ - auVar23._0_2_) * sStack_44;
      uVar61 = auVar45._6_2_ + ((short)Var18 - (short)Var22) * sStack_42;
      uVar63 = auVar31._8_2_ + (auVar15._8_2_ - auVar14._8_2_) * sVar42;
      uVar65 = auVar29._10_2_ + (auVar9._10_2_ - auVar8._10_2_) * sVar42;
      uVar69 = (short)iVar71 + ((ushort)auVar41[8] - (ushort)auVar44[8]) * sVar42;
      uVar75 = (short)(uVar1 >> 8) + ((ushort)auVar41[9] - (ushort)auVar44[9]) * sVar42;
      uVar77 = (short)(CONCAT15(auVar44[10],iVar71) >> 0x20) +
               ((ushort)auVar41[10] - (ushort)auVar44[10]) * sStack_54;
      uVar79 = (short)(((ulong)bVar48 << 0x38) >> 0x30) +
               ((ushort)auVar41[0xb] - (ushort)bVar48) * sStack_52;
      uVar81 = (short)(auVar72._0_10_ >> 0x40) +
               ((ushort)auVar41[0xc] - (ushort)auVar44[0xc]) * sVar42;
      uVar83 = auVar72._10_2_ + ((ushort)auVar41[0xd] - (ushort)auVar44[0xd]) * sVar42;
      uVar85 = auVar73._12_2_ + ((ushort)auVar41[0xe] - (ushort)auVar44[0xe]) * sStack_4c;
      uVar87 = auVar74._14_2_ + ((ushort)auVar41[0xf] - (ushort)auVar44[0xf]) * sStack_4a;
      uVar56 = uVar55 >> 8;
      uVar58 = uVar57 >> 8;
      uVar60 = uVar59 >> 8;
      uVar62 = uVar61 >> 8;
      uVar64 = uVar63 >> 8;
      uVar66 = uVar65 >> 8;
      uVar67 = uVar50 >> 8;
      uVar68 = uVar52 >> 8;
      uVar70 = uVar69 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar80 = uVar79 >> 8;
      uVar82 = uVar81 >> 8;
      uVar84 = uVar83 >> 8;
      uVar86 = uVar85 >> 8;
      uVar88 = uVar87 >> 8;
      (*pauVar37)[0] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
      (*pauVar37)[1] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
      (*pauVar37)[2] = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
      (*pauVar37)[3] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
      (*pauVar37)[4] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
      (*pauVar37)[5] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
      (*pauVar37)[6] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar67);
      (*pauVar37)[7] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar68);
      (*pauVar37)[8] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      (*pauVar37)[9] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      (*pauVar37)[10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      (*pauVar37)[0xb] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
      (*pauVar37)[0xc] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
      (*pauVar37)[0xd] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
      (*pauVar37)[0xe] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
      (*pauVar37)[0xf] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
      lVar34 = 0x10;
      iVar24 = -4;
    }
    pauVar37 = (undefined1 (*) [16])(*pauVar37 + lVar34);
    pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar34);
    iVar38 = iVar38 + iVar24;
  } while( true );
}

Assistant:

static void src_Source(uint32_t* dest, int length, const uint32_t* src,
                           uint32_t const_alpha)
{
    int ialpha;
    if (const_alpha == 255) {
        memcpy(dest, src, length * sizeof(uint32_t));
    } else {
        ialpha = 255 - const_alpha;
        __m128i v_alpha = _mm_set1_epi32(const_alpha);

        LOOP_ALIGNED_U1_A4(dest, length,
                           { /* UOP */
                             *dest = interpolate_pixel(*src, const_alpha,
                                                       *dest, ialpha);
                             dest++;
                             src++;
                             length--;
                           },
                           {/* A4OP */
                            V4_FETCH_SRC_DEST V4_COMP_OP_SRC V4_STORE_DEST
                                                             V4_SRC_DEST_LEN_INC})
    }
}